

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Index.h
# Opt level: O2

void __thiscall Index::~Index(Index *this)

{
  std::__cxx11::string::~string((string *)&this->threadId);
  std::vector<LinkedToken,_std::allocator<LinkedToken>_>::~vector(&this->links);
  std::_Rb_tree<Token,_Token,_std::_Identity<Token>,_std::less<Token>,_std::allocator<Token>_>::
  ~_Rb_tree((_Rb_tree<Token,_Token,_std::_Identity<Token>,_std::less<Token>,_std::allocator<Token>_>
             *)this);
  return;
}

Assistant:

Index(const Thread& thread, const std::vector<Comment>& comments) {
			spdlog::info("indexing new thread id {}", thread.id);

			std::vector<LinkedToken> linksfromThread = thread.extractLinks();
			spdlog::info("links: {}", str::join("\n", linksfromThread));
			moveInsert(std::move(linksfromThread), links);

			std::set<Token> tokensfromThread = thread.extractTokens();
			spdlog::info("tokens: {}", str::join("\n", tokensfromThread));
			moveInsert(std::move(tokensfromThread), opTokens);

			for (const Comment& comment : comments) {
				addToIndex(comment);
			}

			threadId = thread.id;
		}